

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O3

char * __cxxabiv1::(anonymous_namespace)::
       parse_floating_number<double,__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  char cVar3;
  undefined1 uVar4;
  undefined4 *puVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  char cVar9;
  long lVar10;
  undefined4 *puVar11;
  anon_union_8_2_325080ff anon_var_0;
  char num [32];
  undefined1 local_c1;
  undefined4 local_c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_a8;
  value_type local_98;
  char local_58 [40];
  
  if (0x10 < (ulong)((long)last - (long)first)) {
    puVar11 = (undefined4 *)&local_c1;
    lVar10 = 0;
    do {
      cVar3 = first[lVar10];
      iVar6 = isxdigit((int)cVar3);
      if (iVar6 == 0) {
        return first;
      }
      cVar9 = -0x57;
      if ((int)first[lVar10 + 1] - 0x30U < 10) {
        cVar9 = -0x30;
      }
      *(char *)((long)puVar11 + 1) =
           cVar9 + first[lVar10 + 1] + ((9 < (int)cVar3 - 0x30U) * '\t' + cVar3) * '\x10';
      puVar11 = (undefined4 *)((long)puVar11 + 1);
      lVar10 = lVar10 + 2;
    } while (lVar10 != 0x10);
    if (first[0x10] == 'E') {
      if (local_c0 < puVar11) {
        puVar5 = local_c0;
        do {
          puVar8 = (undefined4 *)((long)puVar5 + 1);
          uVar4 = *(undefined1 *)puVar5;
          *(undefined1 *)puVar5 = *(undefined1 *)puVar11;
          *(undefined1 *)puVar11 = uVar4;
          puVar11 = (undefined4 *)((long)puVar11 + -1);
          puVar5 = puVar8;
        } while (puVar8 < puVar11);
      }
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[0x18] = '\0';
      local_58[0x19] = '\0';
      local_58[0x1a] = '\0';
      local_58[0x1b] = '\0';
      local_58[0x1c] = '\0';
      local_58[0x1d] = '\0';
      local_58[0x1e] = '\0';
      local_58[0x1f] = '\0';
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      uVar7 = snprintf(local_58,0x20,"%a",local_c0[0]);
      if (uVar7 < 0x20) {
        local_b8 = &local_a8;
        std::__cxx11::
        basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
        ::_M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                    *)&local_b8,local_58,local_58 + uVar7);
        paVar1 = &local_98.first.field_2;
        if (local_b8 == &local_a8) {
          local_98.first.field_2._8_8_ = local_a8._8_8_;
          local_98.first._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_98.first._M_dataplus._M_p = (pointer)local_b8;
        }
        paVar2 = &local_98.second.field_2;
        local_98.first._M_string_length = local_b0;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        local_98.second._M_string_length = 0;
        local_98.second.field_2._M_local_buf[0] = '\0';
        local_b8 = &local_a8;
        local_98.second._M_dataplus._M_p = (pointer)paVar2;
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_98.second._M_dataplus._M_p != paVar2) {
          free(local_98.second._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_98.first._M_dataplus._M_p != paVar1) {
          free(local_98.first._M_dataplus._M_p);
        }
        if (local_b8 != &local_a8) {
          free(local_b8);
        }
        first = first + 0x11;
      }
    }
  }
  return first;
}

Assistant:

const char*
parse_floating_number(const char* first, const char* last, C& db)
{
    const size_t N = float_data<Float>::mangled_size;
    if (static_cast<std::size_t>(last - first) > N)
    {
        last = first + N;
        union
        {
            Float value;
            char buf[sizeof(Float)];
        };
        const char* t = first;
        char* e = buf;
        for (; t != last; ++t, ++e)
        {
            if (!isxdigit(*t))
                return first;
            unsigned d1 = isdigit(*t) ? static_cast<unsigned>(*t - '0') :
                                        static_cast<unsigned>(*t - 'a' + 10);
            ++t;
            unsigned d0 = isdigit(*t) ? static_cast<unsigned>(*t - '0') :
                                        static_cast<unsigned>(*t - 'a' + 10);
            *e = static_cast<char>((d1 << 4) + d0);
        }
        if (*t == 'E')
        {
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
            std::reverse(buf, e);
#endif
            char num[float_data<Float>::max_demangled_size] = {0};
            int n = snprintf(num, sizeof(num), float_data<Float>::spec, value);
            if (static_cast<std::size_t>(n) >= sizeof(num))
                return first;
            db.names.push_back(typename C::String(num, static_cast<std::size_t>(n)));
            first = t+1;
        }
    }
    return first;
}